

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHeightfieldTerrainShape.cpp
# Opt level: O1

void __thiscall
cbtHeightfieldTerrainShape::initialize
          (cbtHeightfieldTerrainShape *this,int heightStickWidth,int heightStickLength,
          void *heightfieldData,cbtScalar heightScale,cbtScalar minHeight,cbtScalar maxHeight,
          int upAxis,PHY_ScalarType hdt,bool flipQuadEdges)

{
  undefined1 auVar1 [16];
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  
  (this->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType = 0x1c;
  this->m_heightStickWidth = heightStickWidth;
  this->m_heightStickLength = heightStickLength;
  this->m_minHeight = minHeight;
  this->m_maxHeight = maxHeight;
  cVar4 = (cbtScalar)(heightStickWidth + -1);
  this->m_width = cVar4;
  fVar5 = (float)(heightStickLength + -1);
  this->m_length = fVar5;
  this->m_heightScale = heightScale;
  (this->field_10).m_heightfieldDataUnknown = heightfieldData;
  this->m_heightDataType = hdt;
  this->m_flipQuadEdges = flipQuadEdges;
  this->m_useDiamondSubdivision = false;
  this->m_useZigzagSubdivision = false;
  this->m_upAxis = upAxis;
  (this->m_localScaling).m_floats[0] = 1.0;
  (this->m_localScaling).m_floats[1] = 1.0;
  (this->m_localScaling).m_floats[2] = 1.0;
  (this->m_localScaling).m_floats[3] = 0.0;
  if (upAxis == 0) {
    cVar6 = 0.0;
    cVar3 = 0.0;
    cVar2 = minHeight;
    cVar7 = maxHeight;
  }
  else {
    cVar7 = cVar4;
    if (upAxis == 2) {
      cVar6 = 0.0;
      cVar2 = 0.0;
      cVar3 = minHeight;
      cVar4 = fVar5;
      fVar5 = maxHeight;
    }
    else {
      if (upAxis != 1) goto LAB_008fdbef;
      cVar2 = 0.0;
      cVar6 = minHeight;
      cVar3 = 0.0;
      cVar4 = maxHeight;
    }
  }
  (this->m_localAabbMin).m_floats[0] = cVar2;
  (this->m_localAabbMin).m_floats[1] = cVar6;
  (this->m_localAabbMin).m_floats[2] = cVar3;
  (this->m_localAabbMin).m_floats[3] = 0.0;
  (this->m_localAabbMax).m_floats[0] = cVar7;
  (this->m_localAabbMax).m_floats[1] = cVar4;
  (this->m_localAabbMax).m_floats[2] = fVar5;
  (this->m_localAabbMax).m_floats[3] = 0.0;
LAB_008fdbef:
  auVar1 = vinsertps_avx(ZEXT416((uint)(((this->m_localAabbMin).m_floats[0] +
                                        (this->m_localAabbMax).m_floats[0]) * 0.5)),
                         ZEXT416((uint)(((this->m_localAabbMin).m_floats[1] +
                                        (this->m_localAabbMax).m_floats[1]) * 0.5)),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(((this->m_localAabbMin).m_floats[2] +
                                               (this->m_localAabbMax).m_floats[2]) * 0.5)),0x28);
  *(undefined1 (*) [16])(this->m_localOrigin).m_floats = auVar1;
  return;
}

Assistant:

void cbtHeightfieldTerrainShape::initialize(
	int heightStickWidth, int heightStickLength, const void* heightfieldData,
	cbtScalar heightScale, cbtScalar minHeight, cbtScalar maxHeight, int upAxis,
	PHY_ScalarType hdt, bool flipQuadEdges)
{
	// validation
	cbtAssert(heightStickWidth > 1);   // && "bad width");
	cbtAssert(heightStickLength > 1);  // && "bad length");
	cbtAssert(heightfieldData);        // && "null heightfield data");
	// cbtAssert(heightScale) -- do we care?  Trust caller here
	cbtAssert(minHeight <= maxHeight);                                    // && "bad min/max height");
	cbtAssert(upAxis >= 0 && upAxis < 3);                                 // && "bad upAxis--should be in range [0,2]");
	cbtAssert(hdt != PHY_UCHAR || hdt != PHY_FLOAT || hdt != PHY_SHORT);  // && "Bad height data type enum");

	// initialize member variables
	m_shapeType = TERRAIN_SHAPE_PROXYTYPE;
	m_heightStickWidth = heightStickWidth;
	m_heightStickLength = heightStickLength;
	m_minHeight = minHeight;
	m_maxHeight = maxHeight;
	m_width = (cbtScalar)(heightStickWidth - 1);
	m_length = (cbtScalar)(heightStickLength - 1);
	m_heightScale = heightScale;
	m_heightfieldDataUnknown = heightfieldData;
	m_heightDataType = hdt;
	m_flipQuadEdges = flipQuadEdges;
	m_useDiamondSubdivision = false;
	m_useZigzagSubdivision = false;
	m_upAxis = upAxis;
	m_localScaling.setValue(cbtScalar(1.), cbtScalar(1.), cbtScalar(1.));

	// determine min/max axis-aligned bounding box (aabb) values
	switch (m_upAxis)
	{
		case 0:
		{
			m_localAabbMin.setValue(m_minHeight, 0, 0);
			m_localAabbMax.setValue(m_maxHeight, m_width, m_length);
			break;
		}
		case 1:
		{
			m_localAabbMin.setValue(0, m_minHeight, 0);
			m_localAabbMax.setValue(m_width, m_maxHeight, m_length);
			break;
		};
		case 2:
		{
			m_localAabbMin.setValue(0, 0, m_minHeight);
			m_localAabbMax.setValue(m_width, m_length, m_maxHeight);
			break;
		}
		default:
		{
			//need to get valid m_upAxis
			cbtAssert(0);  // && "Bad m_upAxis");
		}
	}

	// remember origin (defined as exact middle of aabb)
	m_localOrigin = cbtScalar(0.5) * (m_localAabbMin + m_localAabbMax);
}